

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

TValue * luaT_gettmbyobj(lua_State *L,TValue *o,TMS event)

{
  int iVar1;
  Table **ppTVar2;
  TValue *pTVar3;
  
  iVar1 = o->tt;
  if (((long)iVar1 == 7) || (iVar1 == 5)) {
    ppTVar2 = &(((o->value).gc)->h).metatable;
  }
  else {
    ppTVar2 = L->l_G->mt + iVar1;
  }
  if (*ppTVar2 != (Table *)0x0) {
    pTVar3 = luaH_getstr(*ppTVar2,L->l_G->tmname[event]);
    return pTVar3;
  }
  return &luaO_nilobject_;
}

Assistant:

static const TValue*luaT_gettmbyobj(lua_State*L,const TValue*o,TMS event){
Table*mt;
switch(ttype(o)){
case 5:
mt=hvalue(o)->metatable;
break;
case 7:
mt=uvalue(o)->metatable;
break;
default:
mt=G(L)->mt[ttype(o)];
}
return(mt?luaH_getstr(mt,G(L)->tmname[event]):(&luaO_nilobject_));
}